

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_list.cpp
# Opt level: O1

ColumnDefinition * __thiscall duckdb::ColumnList::GetColumn(ColumnList *this,LogicalIndex logical)

{
  const_reference pvVar1;
  InternalException *this_00;
  ulong uVar2;
  string local_40;
  
  uVar2 = ((long)(this->columns).
                 super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                 super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->columns).
                 super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                 super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
  if (logical.index <= uVar2 && uVar2 - logical.index != 0) {
    pvVar1 = vector<duckdb::ColumnDefinition,_true>::operator[](&this->columns,logical.index);
    return pvVar1;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Logical column index %lld out of range","");
  InternalException::InternalException<unsigned_long>(this_00,&local_40,logical.index);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const ColumnDefinition &ColumnList::GetColumn(LogicalIndex logical) const {
	if (logical.index >= columns.size()) {
		throw InternalException("Logical column index %lld out of range", logical.index);
	}
	return columns[logical.index];
}